

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit(BinBinaryReader *this,Embed *value)

{
  ushort *puVar1;
  uint *pos;
  ushort *puVar2;
  char *pcVar3;
  BinCompat *pBVar4;
  char cVar5;
  bool bVar6;
  ssize_t sVar7;
  reference pvVar8;
  size_t in_RCX;
  char *pcVar9;
  void *in_RDX;
  void *__buf;
  char *start;
  ulong uVar10;
  bool bVar11;
  Type type;
  bool local_5a;
  Type local_59;
  Embed *local_58;
  ushort *local_50;
  ulong local_48;
  char *local_40;
  BinaryReader *local_38;
  
  local_38 = &this->reader;
  pcVar9 = (this->reader).cur_;
  local_58 = value;
  sVar7 = BinaryReader::read(local_38,(int)value,in_RDX,in_RCX);
  local_5a = SUB81(sVar7,0);
  if (local_5a == false) {
    local_5a = fail_msg(this,"reader.read(value.name)",pcVar9);
  }
  else {
    pos = (uint *)(this->reader).cur_;
    if ((this->reader).cap_ < pos + 1) {
      local_5a = fail_msg(this,"reader.read(size)",(char *)pos);
    }
    else {
      local_48 = (ulong)*pos;
      (this->reader).cur_ = (char *)(pos + 1);
      local_50 = (ushort *)(this->reader).cur_;
      puVar1 = local_50 + 1;
      puVar2 = (ushort *)(this->reader).cap_;
      if (puVar2 < puVar1) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)*local_50;
        (this->reader).cur_ = (char *)puVar1;
      }
      pcVar9 = (this->reader).beg_;
      local_40 = pcVar9;
      if (puVar2 < puVar1) {
        local_5a = fail_msg(this,"reader.read(count)",(char *)local_50);
      }
      else {
        bVar11 = uVar10 == 0;
        if (!bVar11) {
          local_58 = (Embed *)&local_58->items;
          do {
            pvVar8 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<>
                               ((vector<ritobin::Field,_std::allocator<ritobin::Field>_> *)local_58)
            ;
            pcVar3 = (this->reader).cur_;
            sVar7 = BinaryReader::read(local_38,(int)pvVar8,__buf,(size_t)pcVar9);
            if ((char)sVar7 == '\0') {
              local_5a = fail_msg(this,"reader.read(name)",pcVar3);
LAB_001131bc:
              bVar6 = false;
            }
            else {
              pcVar3 = (this->reader).cur_;
              if ((this->reader).cap_ < pcVar3 + 1) {
                pcVar9 = (char *)0x0;
                cVar5 = '\0';
              }
              else {
                cVar5 = *pcVar3;
                pcVar9 = (char *)CONCAT71((int7)((ulong)pcVar9 >> 8),cVar5);
                (this->reader).cur_ = pcVar3 + 1;
                pBVar4 = (this->reader).compat_;
                cVar5 = (**(code **)(*(long *)pBVar4 + 0x10))(pBVar4,cVar5,&local_59);
              }
              if (cVar5 == '\0') {
                local_5a = fail_msg(this,"reader.read(type)",pcVar3);
                goto LAB_001131bc;
              }
              pcVar3 = (this->reader).cur_;
              bVar6 = read_value_of(this,&pvVar8->value,local_59);
              if (!bVar6) {
                local_5a = fail_msg(this,"read_value_of(item, type)",pcVar3);
              }
            }
            if (bVar6 == false) break;
            uVar10 = uVar10 - 1;
            bVar11 = uVar10 == 0;
          } while (!bVar11);
        }
        if ((bVar11) &&
           (local_5a = true,
           (long)(this->reader).cur_ - (long)(this->reader).beg_ !=
           (long)local_50 + (local_48 - (long)local_40))) {
          local_5a = fail_msg(this,"reader.position() == position + size",(this->reader).cur_);
        }
      }
    }
  }
  return (bool)(local_5a & 1);
}

Assistant:

bool read_value_visit(Embed& value) noexcept {
            uint32_t size = 0;
            uint16_t count = 0;
            bin_assert(reader.read(value.name));
            bin_assert(reader.read(size));
            size_t position = reader.position();
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [name, item] = value.items.emplace_back();
                Type type;
                bin_assert(reader.read(name));
                bin_assert(reader.read(type));
                bin_assert(read_value_of(item, type));
            }
            bin_assert(reader.position() == position + size);
            return true;
        }